

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O0

void __thiscall
QtMWidgets::PickerPrivate::makeNextIndex(PickerPrivate *this,QPersistentModelIndex *index)

{
  QAbstractItemModel *pQVar1;
  int iVar2;
  int iVar3;
  QModelIndex local_78;
  QModelIndex local_60;
  QModelIndex local_48;
  QModelIndex local_30;
  QPersistentModelIndex *local_18;
  QPersistentModelIndex *index_local;
  PickerPrivate *this_local;
  
  local_18 = index;
  index_local = (QPersistentModelIndex *)this;
  iVar2 = QPersistentModelIndex::row();
  iVar3 = Picker::count(this->q);
  if (iVar2 == iVar3 + -1) {
    pQVar1 = this->model;
    iVar2 = this->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->root);
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_30,pQVar1,0,iVar2,&local_48);
    QPersistentModelIndex::operator=(local_18,&local_30);
  }
  else {
    pQVar1 = this->model;
    iVar3 = QPersistentModelIndex::row();
    iVar2 = this->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_78,&this->root);
    (**(code **)(*(long *)pQVar1 + 0x60))(&local_60,pQVar1,iVar3 + 1,iVar2,&local_78);
    QPersistentModelIndex::operator=(local_18,&local_60);
  }
  return;
}

Assistant:

void
PickerPrivate::makeNextIndex( QPersistentModelIndex & index )
{
	if( index.row() == q->count() - 1 )
		index = model->index( 0, modelColumn, root );
	else
		index = model->index( index.row() + 1, modelColumn, root );
}